

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O2

void __thiscall QEvdevTouchScreenData::reportPoints(QEvdevTouchScreenData *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  Representation RVar8;
  pointer pTVar9;
  QDebug *pQVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  int iVar14;
  double dVar13;
  Representation RVar15;
  int iVar17;
  undefined1 auVar16 [16];
  QRect QVar18;
  double dStack_a0;
  QDebug local_50;
  Stream *local_48;
  QDebug local_40;
  qreal local_38;
  
  local_38 = *(qreal *)(in_FS_OFFSET + 0x28);
  QVar18 = screenGeometry(this);
  RVar15 = QVar18.x1.m_i;
  RVar8 = QVar18.y1.m_i;
  auVar16._0_4_ = -(uint)(RVar15.m_i + -1 == QVar18.x2.m_i.m_i);
  iVar17 = -(uint)(RVar8.m_i + -1 == QVar18.y2.m_i.m_i);
  auVar16._4_4_ = auVar16._0_4_;
  auVar16._8_4_ = iVar17;
  auVar16._12_4_ = iVar17;
  iVar17 = movmskpd(RVar15.m_i,auVar16);
  if (iVar17 != 3) {
    iVar17 = QVar18.x2.m_i.m_i - RVar15.m_i;
    iVar14 = QVar18.y2.m_i.m_i - RVar8.m_i;
    uVar3 = (uint)(this->m_touchPoints).d.size;
    dVar7 = (double)(iVar14 + iVar17 + 2) /
            (double)((this->hw_range_x_max + this->hw_range_y_max) -
                    (this->hw_range_x_min + this->hw_range_y_min));
    uVar12 = 0;
    uVar11 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar11 = uVar12;
    }
    auVar5._8_4_ = SUB84(dVar7,0);
    auVar5._0_8_ = dVar7;
    auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
    for (; uVar11 * 0x78 - uVar12 != 0; uVar12 = uVar12 + 0x78) {
      pTVar9 = QList<QWindowSystemInterface::TouchPoint>::data(&this->m_touchPoints);
      dVar13 = *(double *)((long)(pTVar9->velocity).v + (uVar12 - 0x24));
      if ((dVar13 != -1.0) || (NAN(dVar13))) {
        dStack_a0 = auVar5._8_8_;
        dStack_a0 = *(double *)((long)(pTVar9->velocity).v + (uVar12 - 0x1c)) * dStack_a0;
        pdVar2 = (double *)((long)(pTVar9->velocity).v + (uVar12 - 0x24));
        *pdVar2 = dVar13 * dVar7;
        pdVar2[1] = dStack_a0;
        dVar13 = dVar13 * dVar7 * 0.5;
        dStack_a0 = dStack_a0 * 0.5;
      }
      else {
        puVar1 = (undefined8 *)((long)(pTVar9->velocity).v + (uVar12 - 0x24));
        *puVar1 = 0x4020000000000000;
        puVar1[1] = 0x4020000000000000;
        dVar13 = 4.0;
        dStack_a0 = 4.0;
      }
      pdVar2 = (double *)((long)(pTVar9->velocity).v + (uVar12 - 0x44));
      dStack_a0 = (pdVar2[1] * (double)iVar14 + (double)RVar8.m_i) - dStack_a0;
      auVar6._8_4_ = SUB84(dStack_a0,0);
      auVar6._0_8_ = (*pdVar2 * (double)iVar17 + (double)RVar15.m_i) - dVar13;
      auVar6._12_4_ = (int)((ulong)dStack_a0 >> 0x20);
      *(undefined1 (*) [16])((long)(pTVar9->velocity).v + (uVar12 - 0x34)) = auVar6;
      iVar4 = this->hw_pressure_min;
      if (iVar4 == 0 && this->hw_pressure_max == 0) {
        dVar13 = 1.0;
        if (*(char *)((long)(pTVar9->velocity).v + (uVar12 - 4)) == '\b') {
          dVar13 = 0.0;
        }
      }
      else {
        dVar13 = (*(double *)((long)(pTVar9->velocity).v + (uVar12 - 0x14)) - (double)iVar4) /
                 (double)(this->hw_pressure_max - iVar4);
      }
      *(double *)((long)(pTVar9->velocity).v + (uVar12 - 0x14)) = dVar13;
      qLcEvents();
      if (((byte)qLcEvents::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        qLcEvents();
        if (((byte)qLcEvents::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
          QMessageLogger::debug();
          pQVar10 = QDebug::operator<<(&local_50,"reporting");
          local_48 = pQVar10->stream;
          *(int *)(local_48 + 0x28) = *(int *)(local_48 + 0x28) + 1;
          ::operator<<((Stream *)&local_40,(TouchPoint *)&local_48);
          QDebug::~QDebug(&local_40);
          QDebug::~QDebug((QDebug *)&local_48);
          QDebug::~QDebug(&local_50);
        }
      }
    }
    if (this->m_filtered == false) {
      QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::DefaultDelivery>
                (0,this->q->m_device,&this->m_touchPoints,0);
    }
    else {
      QEvdevTouchScreenHandler::touchPointsUpdated((QEvdevTouchScreenHandler *)this->q);
    }
  }
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTouchScreenData::reportPoints()
{
    QRect winRect = screenGeometry();
    if (winRect.isNull())
        return;

    const int hw_w = hw_range_x_max - hw_range_x_min;
    const int hw_h = hw_range_y_max - hw_range_y_min;

    // Map the coordinates based on the normalized position. QPA expects 'area'
    // to be in screen coordinates.
    const int pointCount = m_touchPoints.size();
    for (int i = 0; i < pointCount; ++i) {
        QWindowSystemInterface::TouchPoint &tp(m_touchPoints[i]);

        // Generate a screen position that is always inside the active window
        // or the primary screen.  Even though we report this as a QRectF, internally
        // Qt uses QRect/QPoint so we need to bound the size to winRect.size() - QSize(1, 1)
        const qreal wx = winRect.left() + tp.normalPosition.x() * (winRect.width() - 1);
        const qreal wy = winRect.top() + tp.normalPosition.y() * (winRect.height() - 1);
        const qreal sizeRatio = (winRect.width() + winRect.height()) / qreal(hw_w + hw_h);
        if (tp.area.width() == -1) // touch major was not provided
            tp.area = QRectF(0, 0, 8, 8);
        else
            tp.area = QRectF(0, 0, tp.area.width() * sizeRatio, tp.area.height() * sizeRatio);
        tp.area.moveCenter(QPointF(wx, wy));

        // Calculate normalized pressure.
        if (!hw_pressure_min && !hw_pressure_max)
            tp.pressure = tp.state == QEventPoint::State::Released ? 0 : 1;
        else
            tp.pressure = (tp.pressure - hw_pressure_min) / qreal(hw_pressure_max - hw_pressure_min);

        if (Q_UNLIKELY(qLcEvents().isDebugEnabled()))
            qCDebug(qLcEvents) << "reporting" << tp;
    }

    // Let qguiapp pick the target window.
    if (m_filtered)
        emit q->touchPointsUpdated();
    else
        QWindowSystemInterface::handleTouchEvent(nullptr, q->touchDevice(), m_touchPoints);
}